

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

void __thiscall ast::Inst_mrs::~Inst_mrs(Inst_mrs *this)

{
  pointer pcVar1;
  
  (this->super_Instruction).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bfc8
  ;
  pcVar1 = (this->super_Instruction).super_Statement.label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Instruction).super_Statement.label.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

Inst_mrs(Register *rd, Register *rs, Location left) :
		Instruction {left}, rd {rd}, rs {rs} { }